

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O2

void __thiscall
Adjacency_Subgraph_swap_Test::Adjacency_Subgraph_swap_Test(Adjacency_Subgraph_swap_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_0016a280;
  return;
}

Assistant:

TEST(Adjacency_Subgraph, swap) {
  Adjacency_Graph<false> graph_0 = create_graph_saad();
  Adjacency_Graph<false> graph_1 = create_graph_structured<false>(3);
  Adjacency_Subgraph subgraph_0(graph_0, {0, 6, 8, 1, 7});
  Adjacency_Subgraph subgraph_1(graph_1, {4, 5, 7, 8});

  subgraph_0.swap(subgraph_1);
  EXPECT_TRUE(subgraph_0.is_parent(graph_1));
  EXPECT_EQ(subgraph_0.size_vertex(), 4);
  EXPECT_EQ(subgraph_0.size_edge(), 4);
  EXPECT_EQ(subgraph_0.local_global(0), 4);
  EXPECT_EQ(subgraph_0.local_global(1), 5);
  EXPECT_EQ(subgraph_0.local_global(2), 7);
  EXPECT_EQ(subgraph_0.local_global(3), 8);

  EXPECT_TRUE(subgraph_1.is_parent(graph_0));
  EXPECT_EQ(subgraph_1.size_vertex(), 5);
  EXPECT_EQ(subgraph_1.size_edge(), 7);
  EXPECT_EQ(subgraph_1.local_global(0), 0);
  EXPECT_EQ(subgraph_1.local_global(1), 6);
  EXPECT_EQ(subgraph_1.local_global(2), 8);
  EXPECT_EQ(subgraph_1.local_global(3), 1);
  EXPECT_EQ(subgraph_1.local_global(4), 7);
}